

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lax_der_parsing.c
# Opt level: O3

int ecdsa_signature_parse_der_lax
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *input,size_t inputlen)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  uchar *puVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uchar tmpsig [64];
  uchar local_78 [72];
  
  local_78[0x30] = '\0';
  local_78[0x31] = '\0';
  local_78[0x32] = '\0';
  local_78[0x33] = '\0';
  local_78[0x34] = '\0';
  local_78[0x35] = '\0';
  local_78[0x36] = '\0';
  local_78[0x37] = '\0';
  local_78[0x38] = '\0';
  local_78[0x39] = '\0';
  local_78[0x3a] = '\0';
  local_78[0x3b] = '\0';
  local_78[0x3c] = '\0';
  local_78[0x3d] = '\0';
  local_78[0x3e] = '\0';
  local_78[0x3f] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_78[0x2c] = '\0';
  local_78[0x2d] = '\0';
  local_78[0x2e] = '\0';
  local_78[0x2f] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  secp256k1_ecdsa_signature_parse_compact(ctx,sig,local_78);
  iVar3 = 0;
  iVar4 = 0;
  if (((inputlen != 0) && (inputlen != 1)) && (iVar4 = iVar3, *input == '0')) {
    bVar1 = input[1];
    sVar8 = 2;
    if ((char)bVar1 < '\0') {
      if (inputlen - 2 < (ulong)bVar1 - 0x80) {
        return 0;
      }
      sVar8 = (ulong)bVar1 - 0x7e;
    }
    if (((sVar8 != inputlen) && (input[sVar8] == '\x02')) && (sVar8 + 1 != inputlen)) {
      lVar14 = sVar8 + 2;
      uVar6 = (ulong)input[sVar8 + 1];
      if ((char)input[sVar8 + 1] < '\0') {
        uVar7 = uVar6 - 0x80;
        if (inputlen - lVar14 < uVar7) {
          return 0;
        }
        if (uVar7 != 0) {
          lVar9 = sVar8 + uVar6 + -0x7e;
          uVar6 = 0;
          lVar12 = 0;
          puVar11 = input;
LAB_0012a294:
          if (puVar11[lVar14] == '\0') goto code_r0x0012a29b;
          if (7 < uVar7 + lVar12) {
            return 0;
          }
          uVar5 = -lVar12;
          uVar6 = 0;
          do {
            uVar6 = (ulong)input[uVar5 + lVar14] | uVar6 << 8;
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
          lVar14 = (lVar14 - lVar12) + uVar7 + lVar12;
          goto LAB_0012a1fb;
        }
        uVar6 = 0;
        lVar9 = lVar14;
      }
      else {
LAB_0012a1fb:
        lVar9 = lVar14;
        if (inputlen - lVar14 < uVar6) {
          return 0;
        }
      }
LAB_0012a206:
      sVar8 = lVar9 + uVar6;
      if (((sVar8 != inputlen) && (input[sVar8] == '\x02')) && (sVar8 + 1 != inputlen)) {
        lVar14 = sVar8 + 2;
        uVar7 = (ulong)input[sVar8 + 1];
        if ((char)input[sVar8 + 1] < '\0') {
          uVar5 = uVar7 - 0x80;
          if (inputlen - lVar14 < uVar5) {
            return 0;
          }
          if (uVar5 != 0) {
            lVar12 = sVar8 + uVar7 + -0x7e;
            uVar7 = 0;
            uVar10 = 0;
LAB_0012a31e:
            if (input[uVar10 + lVar14] == '\0') goto code_r0x0012a329;
            uVar13 = uVar5 - uVar10;
            if (7 < uVar13) {
              return 0;
            }
            lVar12 = lVar14 + uVar10;
            uVar7 = 0;
            do {
              uVar7 = (ulong)input[uVar10 + lVar14] | uVar7 << 8;
              uVar10 = uVar10 + 1;
            } while (uVar5 != uVar10);
            lVar14 = lVar12 + uVar13;
            goto LAB_0012a232;
          }
          uVar7 = 0;
          lVar12 = lVar14;
        }
        else {
LAB_0012a232:
          lVar12 = lVar14;
          if (inputlen - lVar14 < uVar7) {
            return 0;
          }
        }
LAB_0012a23a:
        bVar2 = true;
        if (uVar6 != 0) {
          uVar5 = 0;
          do {
            if (input[uVar5 + lVar9] != '\0') {
              if (uVar6 - uVar5 < 0x21) {
                memcpy(local_78 + (uVar5 - uVar6) + 0x20,input + uVar5 + lVar9,uVar6 - uVar5);
              }
              else {
                bVar2 = false;
              }
              break;
            }
            uVar5 = uVar5 + 1;
          } while (uVar6 != uVar5);
        }
        if (uVar7 != 0) {
          uVar6 = 0;
          do {
            if (input[uVar6 + lVar12] != '\0') {
              if (0x20 < uVar7 - uVar6) goto LAB_0012a3ca;
              memcpy(local_78 + (uVar6 - uVar7) + 0x40,input + uVar6 + lVar12,uVar7 - uVar6);
              break;
            }
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
        }
        if ((bVar2) &&
           (iVar4 = secp256k1_ecdsa_signature_parse_compact(ctx,sig,local_78), iVar4 != 0)) {
          return 1;
        }
LAB_0012a3ca:
        local_78[0x30] = '\0';
        local_78[0x31] = '\0';
        local_78[0x32] = '\0';
        local_78[0x33] = '\0';
        local_78[0x34] = '\0';
        local_78[0x35] = '\0';
        local_78[0x36] = '\0';
        local_78[0x37] = '\0';
        local_78[0x38] = '\0';
        local_78[0x39] = '\0';
        local_78[0x3a] = '\0';
        local_78[0x3b] = '\0';
        local_78[0x3c] = '\0';
        local_78[0x3d] = '\0';
        local_78[0x3e] = '\0';
        local_78[0x3f] = '\0';
        local_78[0x20] = '\0';
        local_78[0x21] = '\0';
        local_78[0x22] = '\0';
        local_78[0x23] = '\0';
        local_78[0x24] = '\0';
        local_78[0x25] = '\0';
        local_78[0x26] = '\0';
        local_78[0x27] = '\0';
        local_78[0x28] = '\0';
        local_78[0x29] = '\0';
        local_78[0x2a] = '\0';
        local_78[0x2b] = '\0';
        local_78[0x2c] = '\0';
        local_78[0x2d] = '\0';
        local_78[0x2e] = '\0';
        local_78[0x2f] = '\0';
        local_78[0x10] = '\0';
        local_78[0x11] = '\0';
        local_78[0x12] = '\0';
        local_78[0x13] = '\0';
        local_78[0x14] = '\0';
        local_78[0x15] = '\0';
        local_78[0x16] = '\0';
        local_78[0x17] = '\0';
        local_78[0x18] = '\0';
        local_78[0x19] = '\0';
        local_78[0x1a] = '\0';
        local_78[0x1b] = '\0';
        local_78[0x1c] = '\0';
        local_78[0x1d] = '\0';
        local_78[0x1e] = '\0';
        local_78[0x1f] = '\0';
        local_78[0] = '\0';
        local_78[1] = '\0';
        local_78[2] = '\0';
        local_78[3] = '\0';
        local_78[4] = '\0';
        local_78[5] = '\0';
        local_78[6] = '\0';
        local_78[7] = '\0';
        local_78[8] = '\0';
        local_78[9] = '\0';
        local_78[10] = '\0';
        local_78[0xb] = '\0';
        local_78[0xc] = '\0';
        local_78[0xd] = '\0';
        local_78[0xe] = '\0';
        local_78[0xf] = '\0';
        secp256k1_ecdsa_signature_parse_compact(ctx,sig,local_78);
        iVar4 = 1;
      }
    }
  }
  return iVar4;
code_r0x0012a29b:
  lVar12 = lVar12 + -1;
  puVar11 = puVar11 + 1;
  if (uVar7 + lVar12 == 0) goto LAB_0012a206;
  goto LAB_0012a294;
code_r0x0012a329:
  uVar10 = uVar10 + 1;
  if (uVar5 == uVar10) goto LAB_0012a23a;
  goto LAB_0012a31e;
}

Assistant:

int ecdsa_signature_parse_der_lax(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const unsigned char *input, size_t inputlen) {
    size_t rpos, rlen, spos, slen;
    size_t pos = 0;
    size_t lenbyte;
    unsigned char tmpsig[64] = {0};
    int overflow = 0;

    /* Hack to initialize sig with a correctly-parsed but invalid signature. */
    secp256k1_ecdsa_signature_parse_compact(ctx, sig, tmpsig);

    /* Sequence tag byte */
    if (pos == inputlen || input[pos] != 0x30) {
        return 0;
    }
    pos++;

    /* Sequence length bytes */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        pos += lenbyte;
    }

    /* Integer tag byte for R */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for R */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        if (lenbyte >= sizeof(size_t)) {
            return 0;
        }
        rlen = 0;
        while (lenbyte > 0) {
            rlen = (rlen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        rlen = lenbyte;
    }
    if (rlen > inputlen - pos) {
        return 0;
    }
    rpos = pos;
    pos += rlen;

    /* Integer tag byte for S */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for S */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        if (lenbyte >= sizeof(size_t)) {
            return 0;
        }
        slen = 0;
        while (lenbyte > 0) {
            slen = (slen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        slen = lenbyte;
    }
    if (slen > inputlen - pos) {
        return 0;
    }
    spos = pos;

    /* Ignore leading zeroes in R */
    while (rlen > 0 && input[rpos] == 0) {
        rlen--;
        rpos++;
    }
    /* Copy R value */
    if (rlen > 32) {
        overflow = 1;
    } else if (rlen) {
        memcpy(tmpsig + 32 - rlen, input + rpos, rlen);
    }

    /* Ignore leading zeroes in S */
    while (slen > 0 && input[spos] == 0) {
        slen--;
        spos++;
    }
    /* Copy S value */
    if (slen > 32) {
        overflow = 1;
    } else if (slen) {
        memcpy(tmpsig + 64 - slen, input + spos, slen);
    }

    if (!overflow) {
        overflow = !secp256k1_ecdsa_signature_parse_compact(ctx, sig, tmpsig);
    }
    if (overflow) {
        memset(tmpsig, 0, 64);
        secp256k1_ecdsa_signature_parse_compact(ctx, sig, tmpsig);
    }
    return 1;
}